

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O3

ktx_error_code_e
ktxTexture_GLUploadPrivate
          (ktxTexture *This,ktx_glformatinfo *formatInfo,GLuint *pTexture,GLenum *pTarget,
          GLenum *pGlerror)

{
  undefined1 uVar1;
  PFNGLCOMPRESSEDTEXIMAGE3DPROC p_Var2;
  PFNGLTEXIMAGE3DPROC p_Var3;
  GLboolean GVar4;
  byte bVar5;
  ktx_bool_t kVar6;
  GLenum GVar7;
  ktx_uint32_t kVar8;
  ktx_error_code_e kVar9;
  GLubyte *pGVar10;
  char *pcVar11;
  GLenum GVar12;
  ktx_glformatinfo *pkVar13;
  GLint *pGVar14;
  code *iterCb;
  GLuint texname;
  GLint majorVersion;
  ktx_glformatinfo local_68;
  ktx_uint32_t local_58;
  GLenum local_54;
  ktx_uint32_t local_50;
  undefined4 local_4c;
  GLenum *local_48;
  GLuint *local_40;
  GLenum *local_38;
  
  pkVar13 = &local_68;
  if (pGlerror != (GLenum *)0x0) {
    *pGlerror = 0;
  }
  if ((This == (ktxTexture *)0x0) || (pTarget == (GLenum *)0x0)) {
    __assert_fail("This && pTarget",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                  ,0x2c6,
                  "ktx_error_code_e ktxTexture_GLUploadPrivate(ktxTexture *, ktx_glformatinfo *, GLuint *, GLenum *, GLenum *)"
                 );
  }
  pcVar11 = (char *)formatInfo;
  local_38 = pTarget;
  if (contextProfile == 0) {
    local_68.glInternalformat = 1;
    local_68.glFormat = 0;
    pGVar10 = (*gl.glGetString)(0x1f02);
    pcVar11 = strstr((char *)pGVar10,"GL ES");
    if (pcVar11 != (char *)0x0) {
      contextProfile = 4;
    }
    (*gl.glGetIntegerv)(0x821b,(GLint *)&local_68.glInternalformat);
    (*gl.glGetIntegerv)(0x821c,(GLint *)&local_68);
    GVar7 = (*gl.glGetError)();
    pcVar11 = (char *)pkVar13;
    if (GVar7 != 0) {
      pcVar11 = "OpenGL ES %d.%d ";
      if ((contextProfile & 4U) == 0) {
        pcVar11 = "OpenGL %d.%d ";
      }
      pGVar10 = (*gl.glGetString)(0x1f02);
      __isoc99_sscanf(pGVar10,pcVar11,&local_68.glInternalformat);
    }
    if ((contextProfile & 4U) == 0) {
      pGVar14 = &contextProfile;
      (*gl.glGetIntegerv)(0x9126,&contextProfile);
      GVar7 = (*gl.glGetError)();
      if (GVar7 == 0) {
        if ((contextProfile & 1U) != 0) {
          sizedFormats = sizedFormats & 0xfffffffd;
        }
        if (3 < (int)local_68.glInternalformat) {
          supportsCubeMapArrays = 1;
        }
LAB_001f1fa8:
        supportsMaxLevel = 1;
      }
      else {
        contextProfile = 2;
        if (((int)local_68.glInternalformat < 2) &&
           (GVar4 = hasExtension("GL_EXT_texture_sRGB"), GVar4 == '\0')) {
          supportsSRGB = 1;
        }
        if (local_68.glInternalformat == 3) {
          if (local_68.glFormat == 0) {
            R16Formats = R16Formats & 0xfffffffd;
          }
          else if (0 < (int)local_68.glFormat) goto LAB_001f1fa8;
          GVar4 = hasExtension("GL_ARB_texture_query_levels");
          if (GVar4 != '\0') goto LAB_001f1fa8;
        }
        else {
          GVar4 = hasExtension("GL_ARB_texture_rg");
          if (GVar4 == '\0') {
            R16Formats = 0;
          }
          else {
            R16Formats = R16Formats & 0xfffffffd;
          }
        }
      }
      pcVar11 = (char *)pGVar14;
      if ((supportsCubeMapArrays == 0) &&
         (GVar4 = hasExtension("GL_ARB_texture_cube_map_array"), pcVar11 = (char *)pGVar14,
         GVar4 != '\0')) {
        supportsCubeMapArrays = 1;
      }
    }
    else {
      if ((int)local_68.glInternalformat < 3) {
        sizedFormats = 0;
        R16Formats = 0;
        supportsSRGB = 1;
        gl.glGetStringi = (PFNGLGETSTRINGIPROC)0x0;
        gl.glCompressedTexImage1D = (PFNGLCOMPRESSEDTEXIMAGE1DPROC)0x0;
        gl.glTexStorage1D = (PFNGLTEXSTORAGE1DPROC)0x0;
        gl.glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)0x0;
        gl.glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)0x0;
        GVar4 = hasExtension("GL_OES_texture_3D");
        if (GVar4 == '\0') {
          gl.glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)0x0;
          gl.glCompressedTexSubImage3D = (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)0x0;
          gl.glTexImage3D = (PFNGLTEXIMAGE3DPROC)0x0;
          gl.glTexSubImage3D = (PFNGLTEXSUBIMAGE3DPROC)0x0;
        }
        if ((int)local_68.glInternalformat < 2) {
          gl.glGenerateMipmap = (PFNGLGENERATEMIPMAPPROC)0x0;
        }
      }
      else {
        sizedFormats = 1;
        GVar4 = hasExtension("GL_EXT_texture_cube_map_array");
        if (GVar4 != '\0') {
          supportsCubeMapArrays = 1;
        }
        supportsMaxLevel = 1;
      }
      GVar4 = hasExtension("GL_OES_required_internalformat");
      if (GVar4 != '\0') {
        sizedFormats = 3;
      }
    }
  }
  if ((pTexture == (GLuint *)0x0) || (*pTexture == 0)) {
    (*gl.glGenTextures)(1,&local_68.glFormat);
    local_4c = 0;
  }
  else {
    local_4c = (undefined4)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
    local_68.glFormat = *pTexture;
  }
  local_68.glBaseInternalformat = formatInfo->glFormat;
  local_68.glType = formatInfo->glInternalformat;
  local_58 = formatInfo->glType;
  kVar8 = This->numDimensions;
  if (This->isArray == true) {
    if (This->numFaces == 6) {
      GVar12 = 0x9009;
      if (kVar8 != 2) {
        __assert_fail("This->numDimensions == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                      ,0x2db,
                      "ktx_error_code_e ktxTexture_GLUploadPrivate(ktxTexture *, ktx_glformatinfo *, GLuint *, GLenum *, GLenum *)"
                     );
      }
    }
    else {
      GVar7 = 0xde1;
      if (kVar8 == 2) {
        GVar7 = 0x8c1a;
      }
      GVar12 = 0x8c18;
      if (kVar8 != 1) {
        GVar12 = GVar7;
      }
    }
    kVar8 = kVar8 + 1;
    local_50 = This->numLayers;
  }
  else {
    if (This->numFaces == 6) {
      if (kVar8 != 2) {
        __assert_fail("This->numDimensions == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                      ,0x2e9,
                      "ktx_error_code_e ktxTexture_GLUploadPrivate(ktxTexture *, ktx_glformatinfo *, GLuint *, GLenum *, GLenum *)"
                     );
      }
      GVar12 = 0x8513;
    }
    else {
      GVar7 = 0xde1;
      if (kVar8 == 3) {
        GVar7 = 0x806f;
      }
      GVar12 = 0xde0;
      if (kVar8 != 1) {
        GVar12 = GVar7;
      }
    }
    local_50 = 0;
  }
  if (GVar12 == 0x806f) {
    uVar1 = This->isCompressed;
    p_Var2 = gl.glCompressedTexImage3D;
    p_Var3 = gl.glTexImage3D;
joined_r0x001f1c75:
    if (((ktx_bool_t)uVar1 == true) && (p_Var2 == (PFNGLCOMPRESSEDTEXIMAGE3DPROC)0x0)) {
      return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }
    if ((uVar1 == '\0') && (p_Var3 == (PFNGLTEXIMAGE3DPROC)0x0)) {
      return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }
  }
  else {
    if (GVar12 == 0xde0) {
      uVar1 = This->isCompressed;
      p_Var2 = (PFNGLCOMPRESSEDTEXIMAGE3DPROC)gl.glCompressedTexImage1D;
      p_Var3 = (PFNGLTEXIMAGE3DPROC)gl.glTexImage1D;
      goto joined_r0x001f1c75;
    }
    if ((GVar12 == 0x9009) && ((supportsCubeMapArrays & 1) == 0)) {
      return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }
  }
  if (kVar8 == 3) {
    if (This->isCompressed == false) {
      iterCb = texImage3DCallback;
    }
    else {
      iterCb = compressedTexImage3DCallback;
    }
  }
  else if (kVar8 == 2) {
    if (This->isCompressed == false) {
      iterCb = texImage2DCallback;
    }
    else {
      iterCb = compressedTexImage2DCallback;
    }
  }
  else if (kVar8 == 1) {
    if (This->isCompressed == false) {
      iterCb = texImage1DCallback;
    }
    else {
      iterCb = compressedTexImage1DCallback;
    }
  }
  else {
    iterCb = (PFNKTXITERCB)0x0;
  }
  local_48 = pGlerror;
  local_40 = pTexture;
  (*gl.glBindTexture)(GVar12,local_68.glFormat);
  bVar5 = This->generateMipmaps;
  if (((ktx_bool_t)bVar5 == true) && (gl.glGenerateMipmap == (PFNGLGENERATEMIPMAPPROC)0x0)) {
    (*gl.glTexParameteri)(GVar12,0x8191,1);
    bVar5 = This->generateMipmaps;
  }
  if (((bVar5 & 1) == 0) && ((supportsMaxLevel & 1) != 0)) {
    (*gl.glTexParameteri)(GVar12,0x813d,This->numLevels - 1);
  }
  local_68.glInternalformat = 0x8515;
  if (GVar12 != 0x8513) {
    local_68.glInternalformat = GVar12;
  }
  if (This->isCompressed != false) goto LAB_001f1ee1;
  if (sizedFormats == 0) {
    kVar8 = formatInfo->glBaseInternalformat;
  }
  else {
    if ((sizedFormats & 2U) != 0) goto LAB_001f1ee1;
    kVar8 = formatInfo->glBaseInternalformat;
    if (((4 < kVar8 - 0x1906) || ((0x19U >> (kVar8 - 0x1906 & 0x1f) & 1) == 0)) && (kVar8 != 0x8049)
       ) goto LAB_001f1ee1;
  }
  local_68.glType = kVar8;
LAB_001f1ee1:
  kVar6 = ktxTexture_isActiveStream(This);
  if (kVar6) {
    kVar9 = (*This->vtbl->IterateLoadLevelFaces)(This,iterCb,&local_68.glInternalformat);
  }
  else {
    kVar9 = ktxTexture_IterateLevelFaces(This,iterCb,&local_68.glInternalformat);
  }
  if (((local_48 == (GLenum *)0x0) || (kVar9 == KTX_SUCCESS)) || (local_54 == 0)) {
    if (kVar9 == KTX_SUCCESS) {
      if ((gl.glGenerateMipmap != (PFNGLGENERATEMIPMAPPROC)0x0 & This->generateMipmaps) == 1) {
        (*gl.glGenerateMipmap)(GVar12);
      }
      *local_38 = GVar12;
      if (local_40 == (GLuint *)0x0) {
        return KTX_SUCCESS;
      }
      *local_40 = local_68.glFormat;
      return KTX_SUCCESS;
    }
  }
  else {
    *local_48 = local_54;
  }
  if ((char)local_4c == '\0') {
    (*gl.glDeleteTextures)(1,&local_68.glFormat);
  }
  return kVar9;
}

Assistant:

KTX_error_code
ktxTexture_GLUploadPrivate(ktxTexture* This, ktx_glformatinfo* formatInfo,
                           GLuint* pTexture, GLenum* pTarget, GLenum* pGlerror)
{
    GLuint                texname;
    GLenum                target = GL_TEXTURE_2D;
    int                   texnameUser;
    KTX_error_code        result = KTX_SUCCESS;
    ktx_cbdata            cbData;
    PFNKTXITERCB          iterCb = NULL;
    int                   dimensions;

    if (pGlerror)
        *pGlerror = GL_NO_ERROR;

    assert(This && pTarget);

    if (contextProfile == 0)
        discoverContextCapabilities();

    texnameUser = pTexture && *pTexture;
    if (texnameUser) {
        texname = *pTexture;
    } else {
        glGenTextures(1, &texname);
    }

    cbData.glFormat = formatInfo->glFormat;
    cbData.glInternalformat = formatInfo->glInternalformat;
    cbData.glType = formatInfo->glType;

    dimensions = This->numDimensions;
    if (This->isArray) {
        dimensions += 1;
        if (This->numFaces == 6) {
            /* ktxCheckHeader1_ should have caught this. */
            assert(This->numDimensions == 2);
            target = GL_TEXTURE_CUBE_MAP_ARRAY;
        } else {
            switch (This->numDimensions) {
              case 1: target = GL_TEXTURE_1D_ARRAY; break;
              case 2: target = GL_TEXTURE_2D_ARRAY; break;
              /* _ktxCheckHeader should have caught this. */
              default: assert(KTX_TRUE);
            }
        }
        cbData.numLayers = This->numLayers;
    } else {
        if (This->numFaces == 6) {
            /* ktxCheckHeader1_ should have caught this. */
            assert(This->numDimensions == 2);
            target = GL_TEXTURE_CUBE_MAP;
        } else {
            switch (This->numDimensions) {
              case 1: target = GL_TEXTURE_1D; break;
              case 2: target = GL_TEXTURE_2D; break;
              case 3: target = GL_TEXTURE_3D; break;
              /* _ktxCheckHeader shold have caught this. */
              default: assert(KTX_TRUE);
            }
        }
        cbData.numLayers = 0;
    }

    if (target == GL_TEXTURE_1D &&
        ((This->isCompressed && (gl.glCompressedTexImage1D == NULL)) ||
         (!This->isCompressed && (gl.glTexImage1D == NULL))))
    {
        return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }

    /* Reject 3D texture if unsupported. */
    if (target == GL_TEXTURE_3D &&
        ((This->isCompressed && (gl.glCompressedTexImage3D == NULL)) ||
         (!This->isCompressed && (gl.glTexImage3D == NULL))))
    {
        return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }

    /* Reject cube map arrays if not supported. */
    if (target == GL_TEXTURE_CUBE_MAP_ARRAY && !supportsCubeMapArrays) {
        return KTX_UNSUPPORTED_TEXTURE_TYPE;
    }

    /* XXX Need to reject other array textures & cube maps if not supported. */

    switch (dimensions) {
      case 1:
        iterCb = This->isCompressed
                  ? compressedTexImage1DCallback : texImage1DCallback;
        break;
      case 2:
        iterCb = This->isCompressed
                  ? compressedTexImage2DCallback : texImage2DCallback;
            break;
      case 3:
        iterCb = This->isCompressed
                  ? compressedTexImage3DCallback : texImage3DCallback;
        break;
      default:
            assert(KTX_TRUE);
    }

    glBindTexture(target, texname);

    // Prefer glGenerateMipmaps over GL_GENERATE_MIPMAP
    if (This->generateMipmaps && (gl.glGenerateMipmap == NULL)) {
        glTexParameteri(target, GL_GENERATE_MIPMAP, GL_TRUE);
    }

    if (!This->generateMipmaps && supportsMaxLevel)
        glTexParameteri(target, GL_TEXTURE_MAX_LEVEL, This->numLevels - 1);

    if (target == GL_TEXTURE_CUBE_MAP) {
        cbData.glTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X;
    } else {
        cbData.glTarget = target;
    }

    if (!This->isCompressed) {
#if SUPPORT_LEGACY_FORMAT_CONVERSION
        // If sized legacy formats are supported there is no need to convert.
        // If only unsized formats are supported, there is no point in
        // converting as the modern formats aren't supported either.
        if (sizedFormats == _NON_LEGACY_FORMATS && supportsSwizzle) {
            convertFormat(target, &cbData.glFormat, &cbData.glInternalformat);
        } else if (sizedFormats == _NO_SIZED_FORMATS)
            cbData.glInternalformat = formatInfo->glBaseInternalformat;
#else
        // When no sized formats are supported, or legacy sized formats are not
        // supported, must change internal format.
        if (sizedFormats == _NO_SIZED_FORMATS
            || (!(sizedFormats & _LEGACY_FORMATS) &&
                (formatInfo->glBaseInternalformat == GL_ALPHA
                || formatInfo->glBaseInternalformat == GL_LUMINANCE
                || formatInfo->glBaseInternalformat == GL_LUMINANCE_ALPHA
                || formatInfo->glBaseInternalformat == GL_INTENSITY))) {
            cbData.glInternalformat = formatInfo->glBaseInternalformat;
        }
#endif
    }

    if (ktxTexture_isActiveStream(ktxTexture(This)))
        result = ktxTexture_IterateLoadLevelFaces(This, iterCb, &cbData);
    else
        result = ktxTexture_IterateLevelFaces(This, iterCb, &cbData);

    /* GL errors are the only reason for failure. */
    if (result != KTX_SUCCESS && cbData.glError != GL_NO_ERROR) {
        if (pGlerror)
            *pGlerror = cbData.glError;
    }

    if (result == KTX_SUCCESS)
    {
        // Prefer glGenerateMipmaps over GL_GENERATE_MIPMAP
        if (This->generateMipmaps && gl.glGenerateMipmap) {
            gl.glGenerateMipmap(target);
        }
        *pTarget = target;
        if (pTexture) {
            *pTexture = texname;
        }
    } else if (!texnameUser) {
        glDeleteTextures(1, &texname);
    }
    return result;
}